

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::UDFAverageFunction>
               (dtime_t *idata,AggregateInputData *aggr_input_data,
               udf_avg_state_t<duckdb::dtime_t> *state,idx_t count,ValidityMask *mask)

{
  long lVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = 0;
  uVar5 = 0;
  do {
    if (uVar5 == count + 0x3f >> 6) {
      return;
    }
    if (puVar2 == (unsigned_long *)0x0) {
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
LAB_002bc1ab:
      for (; uVar4 = uVar6, uVar6 < uVar7; uVar6 = uVar6 + 1) {
        lVar1 = idata[uVar6].micros;
        state->count = state->count + 1;
        (state->sum).micros = lVar1 + (state->sum).micros;
      }
    }
    else {
      uVar3 = puVar2[uVar5];
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
      if (uVar3 == 0xffffffffffffffff) goto LAB_002bc1ab;
      uVar4 = uVar7;
      if (uVar3 != 0) {
        for (uVar8 = 0; uVar4 = uVar6 + uVar8, uVar6 + uVar8 < uVar7; uVar8 = uVar8 + 1) {
          if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
            lVar1 = idata[uVar6 + uVar8].micros;
            state->count = state->count + 1;
            (state->sum).micros = lVar1 + (state->sum).micros;
          }
        }
      }
    }
    uVar6 = uVar4;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static inline void NullaryScatterLoop(STATE_TYPE **__restrict states, AggregateInputData &aggr_input_data,
	                                      const SelectionVector &ssel, idx_t count) {

		for (idx_t i = 0; i < count; i++) {
			auto sidx = ssel.get_index(i);
			OP::template Operation<STATE_TYPE, OP>(*states[sidx], aggr_input_data, sidx);
		}
	}